

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

HashBuilder * __thiscall soul::HashBuilder::operator<<(HashBuilder *this,char c)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t n;
  
  uVar1 = this->index;
  uVar2 = (uint)(byte)c;
  uVar3 = uVar1 + uVar2 & 0xff;
  this->data[uVar3] = this->data[uVar3] * 7 ^ uVar2;
  uVar3 = uVar1 + 1 & 0xff;
  this->data[uVar3] = (uVar1 + 1) % 0x1ff + uVar2 + this->data[uVar3] * 0x1f;
  uVar3 = uVar1 + 2 & 0xff;
  this->data[uVar3] = this->data[uVar3] * 0x89 - uVar2;
  this->index = uVar1 + 3;
  return this;
}

Assistant:

HashBuilder& HashBuilder::operator<< (char c) noexcept
{
    auto n = (uint8_t) c;
    data[(index + n) & 255] = (data[(index + n) & 255] * 7) ^ n;
    ++index;
    data[index & 255] = (data[index & 255] * 31) + n + (index % 511);
    ++index;
    data[index & 255] = (data[index & 255] * 137) - n;
    ++index;

    return *this;
}